

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenFunctionRunPasses
               (BinaryenFunctionRef func,BinaryenModuleRef module,char **passes,
               BinaryenIndex numPasses)

{
  pointer pcVar1;
  const_iterator cVar2;
  mapped_type *pmVar3;
  long lVar4;
  ulong uVar5;
  PassOptions *pPVar6;
  undefined8 uVar7;
  undefined8 *puVar8;
  undefined8 uVar9;
  undefined1 local_1c0 [120];
  __node_base_ptr *local_148;
  size_type local_140;
  __node_base local_138;
  size_type sStack_130;
  float local_128;
  size_t local_120;
  __node_base_ptr p_Stack_118;
  __node_base_ptr *local_110;
  size_type local_108;
  __node_base local_100;
  size_type sStack_f8;
  float local_f0;
  size_t local_e8;
  __node_base_ptr p_Stack_e0;
  undefined2 local_d8;
  key_type local_d0;
  key_type local_b0;
  string local_90;
  ulong local_70;
  BinaryenFunctionRef local_68;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_60;
  bool local_40;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  
  local_1c0._0_8_ = &PTR__PassRunner_01091270;
  local_1c0._16_8_ = &module->allocator;
  local_1c0._24_8_ = (pointer)0x0;
  local_1c0[0x20] = 0;
  local_1c0._33_7_ = 0;
  local_1c0[0x28] = 0;
  local_1c0._41_8_ = 0;
  local_1c0[0x31] = true;
  local_1c0[0x32] = true;
  local_1c0._52_4_ = 0;
  local_1c0._56_4_ = 0;
  local_1c0._60_4_ = 2;
  local_1c0._64_4_ = 0xffffffff;
  local_1c0._68_4_ = 0x14;
  local_1c0[0x48] = false;
  local_1c0[0x68] = false;
  local_148 = &p_Stack_118;
  local_1c0._76_4_ = 0;
  local_1c0[0x50] = false;
  local_1c0[0x51] = false;
  local_1c0[0x52] = false;
  local_1c0[0x53] = false;
  local_1c0[0x54] = false;
  local_1c0[0x55] = false;
  local_1c0[0x56] = false;
  local_1c0[0x57] = false;
  local_1c0[0x58] = false;
  local_140 = 1;
  local_138._M_nxt = (_Hash_node_base *)0x0;
  sStack_130 = 0;
  local_128 = 1.0;
  local_120 = 0;
  p_Stack_118 = (__node_base_ptr)0x0;
  local_110 = &p_Stack_e0;
  local_108 = 1;
  local_100._M_nxt = (_Hash_node_base *)0x0;
  sStack_f8 = 0;
  local_f0 = 1.0;
  local_e8 = 0;
  p_Stack_e0 = (__node_base_ptr)0x0;
  local_d8._0_1_ = false;
  local_d8._1_1_ = false;
  pPVar6 = &globalPassOptions;
  puVar8 = (undefined8 *)(local_1c0 + 0x30);
  local_68 = func;
  for (lVar4 = 8; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar8 = *(undefined8 *)pPVar6;
    pPVar6 = (PassOptions *)&pPVar6->shrinkLevel;
    puVar8 = puVar8 + 1;
  }
  local_1c0[0x70] = globalPassOptions.targetJS;
  local_1c0._8_8_ = module;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_148,&globalPassOptions.arguments._M_h);
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&local_110,&globalPassOptions.passesToSkip._M_h);
  if (numPasses != 0) {
    local_70 = (ulong)numPasses;
    uVar5 = 0;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,passes[uVar5],&local_33);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,passes[uVar5],&local_32);
      cVar2 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&globalPassOptions.arguments._M_h,&local_d0);
      if (cVar2.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,passes[uVar5],&local_31);
        pmVar3 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&globalPassOptions.arguments,&local_b0);
        local_60._M_value._M_dataplus._M_p = (_Alloc_hider)((long)&local_60._M_value + 0x10);
        pcVar1 = (pmVar3->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_60,pcVar1,pcVar1 + pmVar3->_M_string_length);
      }
      local_40 = cVar2.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                 ._M_cur != (__node_type *)0x0;
      wasm::PassRunner::add
                ((PassRunner *)local_1c0,&local_90,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60);
      if (cVar2.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        if ((local_40 == true) &&
           (local_40 = false, uVar7 = local_60._16_8_, uVar9 = local_60._M_value._M_dataplus._M_p,
           local_60._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_60._M_value + 0x10)))
        goto LAB_00d10ad6;
      }
      else {
        if ((local_40 == true) &&
           (local_40 = false,
           local_60._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_60._M_value + 0x10))) {
          operator_delete((void *)local_60._M_value._M_dataplus._M_p,local_60._16_8_ + 1);
        }
        uVar7 = local_b0.field_2._M_allocated_capacity;
        uVar9 = local_b0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
LAB_00d10ad6:
          operator_delete((void *)uVar9,uVar7 + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      uVar5 = uVar5 + 1;
    } while (local_70 != uVar5);
  }
  wasm::PassRunner::runOnFunction((PassRunner *)local_1c0,local_68);
  wasm::PassRunner::~PassRunner((PassRunner *)local_1c0);
  return;
}

Assistant:

void BinaryenFunctionRunPasses(BinaryenFunctionRef func,
                               BinaryenModuleRef module,
                               const char** passes,
                               BinaryenIndex numPasses) {
  PassRunner passRunner((Module*)module);
  passRunner.options = globalPassOptions;
  for (BinaryenIndex i = 0; i < numPasses; i++) {
    passRunner.add(passes[i],
                   globalPassOptions.arguments.count(passes[i]) > 0
                     ? globalPassOptions.arguments[passes[i]]
                     : std::optional<std::string>());
  }
  passRunner.runOnFunction((Function*)func);
}